

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common_expression_delete.hpp
# Opt level: O2

void __thiscall
optimization::common_expr_del::Common_Expr_Del::init_funcs
          (Common_Expr_Del *this,MirPackage *package)

{
  _Rb_tree_header *p_Var1;
  _Base_ptr p_Var2;
  int iVar3;
  _Base_ptr p_Var4;
  size_type sVar5;
  _Rb_tree_node_base *p_Var6;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  unique_ptr<mir::inst::Inst,_std::default_delete<mir::inst::Inst>_> *inst;
  _Base_ptr p_Var7;
  
  p_Var1 = &(package->functions)._M_t._M_impl.super__Rb_tree_header;
  this_00 = &this->mergeable_funcs;
  for (p_Var4 = (package->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var4 != p_Var1; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
    if (*(char *)&p_Var4[3]._M_parent[1]._M_left == '\0') {
      std::
      _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
      ::_M_insert_unique<std::__cxx11::string_const&>
                ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                  *)this_00,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var4 + 1));
    }
  }
  p_Var4 = (package->functions)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var4 == p_Var1) {
      return;
    }
    for (p_Var6 = *(_Rb_tree_node_base **)(p_Var4 + 6);
        p_Var6 != (_Rb_tree_node_base *)&p_Var4[5]._M_left;
        p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
      p_Var2 = p_Var6[3]._M_left;
      for (p_Var7 = p_Var6[3]._M_parent; p_Var7 != p_Var2; p_Var7 = (_Base_ptr)&p_Var7->_M_parent) {
        iVar3 = (**(code **)(**(long **)p_Var7 + 8))();
        if (iVar3 == 3) {
LAB_001234b6:
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::erase(&this_00->_M_t,(key_type *)(p_Var4 + 1));
          goto LAB_001234c3;
        }
        iVar3 = (**(code **)(**(long **)p_Var7 + 8))();
        if (iVar3 == 4) goto LAB_001234b6;
        iVar3 = (**(code **)(**(long **)p_Var7 + 8))();
        if (iVar3 == 6) {
          sVar5 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::count(this_00,(key_type *)(*(long *)p_Var7 + 0x18));
          if (sVar5 == 0) goto LAB_001234b6;
        }
      }
    }
LAB_001234c3:
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  } while( true );
}

Assistant:

void init_funcs(mir::inst::MirPackage& package) {
    for (auto& funcpair : package.functions) {
      if (funcpair.second.type->is_extern) continue;
      mergeable_funcs.insert(funcpair.first);
    }
    for (auto& funcpair : package.functions) {
      bool flag = false;
      for (auto& blkpair : funcpair.second.basic_blks) {
        for (auto& inst : blkpair.second.inst) {
          if (inst->inst_kind() == mir::inst::InstKind::Load ||
              inst->inst_kind() == mir::inst::InstKind::Store) {
            flag = true;
            break;
          }
          if (inst->inst_kind() == mir::inst::InstKind::Call) {
            auto& i = *inst;
            auto callInst = dynamic_cast<mir::inst::CallInst*>(&i);
            if (!mergeable_funcs.count(callInst->func)) {
              flag = true;
              break;
            }
          }
        }
        if (flag) {
          break;
        }
      }
      if (flag) {
        mergeable_funcs.erase(funcpair.first);
      }
    }
  }